

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

bool __thiscall ASDCP::Dictionary::AddEntry(Dictionary *this,MDDEntry *Entry,ui32_t index)

{
  byte bVar1;
  byte bVar2;
  undefined5 uVar3;
  bool bVar4;
  ILogSink *pIVar5;
  char *pcVar6;
  pointer ppVar7;
  MDDEntry *pMVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>,_bool> pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_ASDCP::UL>_>,_bool> pVar10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_150;
  _Base_ptr local_128;
  undefined1 local_120;
  pair<const_unsigned_int,_ASDCP::UL> local_118;
  _Base_ptr local_f0;
  undefined1 local_e8;
  pair<const_ASDCP::UL,_unsigned_int> local_e0;
  _Self local_b8 [3];
  _Self local_a0;
  iterator ii;
  char buf [64];
  UL TmpUL;
  _Self local_30;
  iterator rii;
  bool result;
  ui32_t index_local;
  MDDEntry *Entry_local;
  Dictionary *this_local;
  
  rii._M_node._4_4_ = index;
  if (index < 0x246) {
    rii._M_node._3_1_ = 1;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
         ::find(&this->m_md_rev_lookup,(key_type *)((long)&rii._M_node + 4));
    TmpUL.super_Identifier<16U>._24_8_ =
         std::
         map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
         ::end(&this->m_md_rev_lookup);
    bVar4 = std::operator!=(&local_30,(_Self *)(TmpUL.super_Identifier<16U>.m_Value + 0xf));
    if (bVar4) {
      DeleteEntry(this,rii._M_node._4_4_);
      rii._M_node._3_1_ = 0;
    }
    UL::UL((UL *)(buf + 0x38),Entry->ul);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::find(&this->m_md_lookup,(UL *)(buf + 0x38));
    local_b8[0]._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::end(&this->m_md_lookup);
    bVar4 = std::operator!=(&local_a0,local_b8);
    if (bVar4) {
      pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar6 = UL::EncodeString((UL *)(buf + 0x38),(char *)&ii,0x40);
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_a0);
      bVar1 = this->m_MDD_Table[ppVar7->second].tag.a;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_a0);
      bVar2 = this->m_MDD_Table[ppVar7->second].tag.b;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_a0);
      Kumu::ILogSink::Warn
                (pIVar5,"Duplicate Dictionary item: %s (%02x, %02x) %s | (%02x, %02x) %s\n",pcVar6,
                 (ulong)bVar1,(ulong)bVar2,this->m_MDD_Table[ppVar7->second].name,
                 (uint)(Entry->tag).a,(uint)(Entry->tag).b,Entry->name);
    }
    std::pair<const_ASDCP::UL,_unsigned_int>::pair<ASDCP::UL_&,_unsigned_int_&,_true>
              (&local_e0,(UL *)(buf + 0x38),(uint *)((long)&rii._M_node + 4));
    pVar9 = std::
            map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
            ::insert(&this->m_md_lookup,&local_e0);
    local_f0 = (_Base_ptr)pVar9.first._M_node;
    local_e8 = pVar9.second;
    std::pair<const_ASDCP::UL,_unsigned_int>::~pair(&local_e0);
    std::pair<const_unsigned_int,_ASDCP::UL>::pair<unsigned_int_&,_ASDCP::UL_&,_true>
              (&local_118,(uint *)((long)&rii._M_node + 4),(UL *)(buf + 0x38));
    pVar10 = std::
             map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
             ::insert(&this->m_md_rev_lookup,&local_118);
    local_128 = (_Base_ptr)pVar10.first._M_node;
    local_120 = pVar10.second;
    std::pair<const_unsigned_int,_ASDCP::UL>::~pair(&local_118);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::pair<const_char_*const_&,_unsigned_int_&,_true>
              (&local_150,&Entry->name,(uint *)((long)&rii._M_node + 4));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::insert(&this->m_md_sym_lookup,&local_150);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_150);
    pMVar8 = this->m_MDD_Table + rii._M_node._4_4_;
    *(undefined8 *)pMVar8->ul = *(undefined8 *)Entry->ul;
    *(undefined8 *)(pMVar8->ul + 8) = *(undefined8 *)(Entry->ul + 8);
    bVar4 = Entry->optional;
    uVar3 = *(undefined5 *)&Entry->field_0x13;
    pMVar8->tag = Entry->tag;
    pMVar8->optional = bVar4;
    *(undefined5 *)&pMVar8->field_0x13 = uVar3;
    pMVar8->name = Entry->name;
    this_local._7_1_ = (bool)(rii._M_node._3_1_ & 1);
    UL::~UL((UL *)(buf + 0x38));
  }
  else {
    pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Warn
              (pIVar5,"UL Dictionary: index exceeds maximum: %d\n",(ulong)rii._M_node._4_4_);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ASDCP::Dictionary::AddEntry(const MDDEntry& Entry, ui32_t index)
{
  if ( index >= (ui32_t)MDD_Max )
    {
      Kumu::DefaultLogSink().Warn("UL Dictionary: index exceeds maximum: %d\n", index);
      return false;
    }

  bool result = true;
  // is this index already there?
  std::map<ui32_t, ASDCP::UL>::iterator rii = m_md_rev_lookup.find(index);

  if ( rii != m_md_rev_lookup.end() )
    {
      DeleteEntry(index);
      result = false;
    }

  UL TmpUL(Entry.ul);

#define MDD_AUTHORING_MODE
#ifdef MDD_AUTHORING_MODE
  char buf[64];
  std::map<ASDCP::UL, ui32_t>::iterator ii = m_md_lookup.find(TmpUL);
  if ( ii != m_md_lookup.end() )
    {
      Kumu::DefaultLogSink().Warn("Duplicate Dictionary item: %s (%02x, %02x) %s | (%02x, %02x) %s\n",
	      TmpUL.EncodeString(buf, 64),
	      m_MDD_Table[ii->second].tag.a, m_MDD_Table[ii->second].tag.b,
	      m_MDD_Table[ii->second].name,
	      Entry.tag.a, Entry.tag.b, Entry.name);
    }
#endif

  m_md_lookup.insert(std::map<UL, ui32_t>::value_type(TmpUL, index));
  m_md_rev_lookup.insert(std::map<ui32_t, UL>::value_type(index, TmpUL));
  m_md_sym_lookup.insert(std::map<std::string, ui32_t>::value_type(Entry.name, index));
  m_MDD_Table[index] = Entry;

  return result;
}